

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

GLuint __thiscall
gl3cts::TransformFeedback::CheckGetXFBVarying::numberOfAttributes
          (CheckGetXFBVarying *this,GLuint capture_way,GLuint shader_case,GLuint varying_type)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = s_varying_types[varying_type].components_count;
  if (s_capture_ways[capture_way] == 0x8c8d && (uint)this->m_max_xfb_separate_components < uVar1) {
    return 0;
  }
  uVar3 = (&this->m_max_varying_components)
          [(ulong)(s_shader_cases[shader_case].geometry_shader != (GLchar *)0x0) * 2] - 4;
  if (s_capture_ways[capture_way] == 0x8c8c) {
    uVar2 = this->m_max_xfb_interleaved_components;
  }
  else {
    uVar2 = this->m_max_xfb_separate_components * uVar1;
  }
  uVar2 = uVar2 / uVar1;
  if (uVar3 < uVar2 * uVar1) {
    uVar2 = uVar3 / uVar1;
  }
  uVar3 = this->m_max_varying_vectors;
  if (4 < uVar1) {
    uVar3 = uVar3 >> 2;
  }
  if (uVar2 < uVar3) {
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

glw::GLuint gl3cts::TransformFeedback::CheckGetXFBVarying::numberOfAttributes(glw::GLuint capture_way,
																			  glw::GLuint shader_case,
																			  glw::GLuint varying_type)
{
	/* Setup limits of the case. */
	const glw::GLuint max_total_components =
		((s_shader_cases[shader_case].geometry_shader == DE_NULL) ? m_max_varying_components :
																	m_max_geometry_total_output_components) -
		4 /* gl_Position is not captured */;

	const glw::GLuint attribute_components = s_varying_types[varying_type].components_count;
	const glw::GLuint max_xfb_components   = (s_capture_ways[capture_way] == GL_INTERLEAVED_ATTRIBS) ?
											   m_max_xfb_interleaved_components :
											   (attribute_components * m_max_xfb_separate_components);

	if (s_capture_ways[capture_way] == GL_SEPARATE_ATTRIBS)
	{
		if (attribute_components > glw::GLuint(m_max_xfb_separate_components))
		{
			return 0;
		}
	}

	/* Setup number of attributes. */
	glw::GLuint number_of_attributes = max_xfb_components / attribute_components;

	/* Clamp to limits. */
	if (number_of_attributes * attribute_components > max_total_components)
	{
		number_of_attributes = max_total_components / attribute_components;
	}

	/* Vectors limit. */
	if (attribute_components <= 4)
	{
		if (number_of_attributes > glw::GLuint(m_max_varying_vectors))
		{
			number_of_attributes = m_max_varying_vectors;
		}
	}
	else
	{
		if (number_of_attributes > glw::GLuint(m_max_varying_vectors) / 4)
		{
			number_of_attributes = glw::GLuint(m_max_varying_vectors) / 4;
		}
	}

	/* Return. */
	return number_of_attributes;
}